

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

function<void_(UdpSocket_*)> * __thiscall
UdpSocketImpl::BindFuncBytesReceived
          (function<void_(UdpSocket_*)> *__return_storage_ptr__,UdpSocketImpl *this,
          function<void_(UdpSocket_*)> *fBytesReceived)

{
  function<void_(UdpSocket_*)> *fBytesReceived_local;
  UdpSocketImpl *this_local;
  
  std::function<void_(UdpSocket_*)>::swap(&this->m_fBytesReceived,fBytesReceived);
  std::function<void_(UdpSocket_*)>::function(__return_storage_ptr__,fBytesReceived);
  return __return_storage_ptr__;
}

Assistant:

function<void(UdpSocket*)> UdpSocketImpl::BindFuncBytesReceived(function<void(UdpSocket*)> fBytesReceived) noexcept
{
    m_fBytesReceived.swap(fBytesReceived);
    return fBytesReceived;
}